

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int math_abs(lua_State *L)

{
  int iVar1;
  lua_Number lVar2;
  undefined8 local_18;
  lua_Integer n;
  lua_State *L_local;
  
  iVar1 = lua_isinteger(L,1);
  if (iVar1 == 0) {
    lVar2 = luaL_checknumber(L,1);
    lua_pushnumber(L,ABS(lVar2));
  }
  else {
    local_18 = lua_tointegerx(L,1,(int *)0x0);
    if (local_18 < 0) {
      local_18 = -local_18;
    }
    lua_pushinteger(L,local_18);
  }
  return 1;
}

Assistant:

static int math_abs(lua_State *L) {
    if (lua_isinteger(L, 1)) {
        lua_Integer n = lua_tointeger(L, 1);
        if (n < 0) n = (lua_Integer) (0u - (lua_Unsigned) n);
        lua_pushinteger(L, n);
    } else
        lua_pushnumber(L, l_mathop(fabs)(luaL_checknumber(L, 1)));
    return 1;
}